

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBlockMap32::RescanPage
          (HeapBlockMap32 *this,void *dirtyPage,bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  HeapBlockType blockType_00;
  L2MapChunk *chunk_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  HeapBlockType blockType;
  uint id2;
  L2MapChunk *chunk;
  uint id1;
  Recycler *recycler_local;
  bool *anyObjectsMarkedOnPage_local;
  void *dirtyPage_local;
  HeapBlockMap32 *this_local;
  
  uVar3 = GetLevel1Id(dirtyPage);
  chunk_00 = this->map[uVar3];
  if (chunk_00 == (L2MapChunk *)0x0) goto LAB_00910f43;
  uVar3 = GetLevel2Id(dirtyPage);
  blockType_00 = chunk_00->blockInfo[uVar3].blockType;
  switch(blockType_00) {
  case FreeBlockType:
    goto LAB_00910f43;
  case LargeBlockTypeCount:
  case SmallNormalBlockWithBarrierType:
    this_local._7_1_ =
         RescanHeapBlock<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                   (this,dirtyPage,blockType_00,chunk_00,uVar3,anyObjectsMarkedOnPage,recycler);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2b7,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
LAB_00910f43:
    this_local._7_1_ = false;
    break;
  case SmallFinalizableBlockType:
  case MediumAllocBlockTypeCount:
    this_local._7_1_ =
         RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                   (this,dirtyPage,blockType_00,chunk_00,uVar3,anyObjectsMarkedOnPage,recycler);
    break;
  case MediumNormalBlockType:
  case MediumNormalBlockWithBarrierType:
    this_local._7_1_ =
         RescanHeapBlock<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                   (this,dirtyPage,blockType_00,chunk_00,uVar3,anyObjectsMarkedOnPage,recycler);
    break;
  case MediumFinalizableBlockType:
  case MediumFinalizableBlockWithBarrierType:
    this_local._7_1_ =
         RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                   (this,dirtyPage,blockType_00,chunk_00,uVar3,anyObjectsMarkedOnPage,recycler);
  }
  return this_local._7_1_;
}

Assistant:

bool
HeapBlockMap32::RescanPage(void * dirtyPage, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    uint id1 = GetLevel1Id(dirtyPage);
    L2MapChunk * chunk = map[id1];
    if (chunk != nullptr)
    {
        uint id2 = GetLevel2Id(dirtyPage);
        HeapBlock::HeapBlockType blockType = chunk->blockInfo[id2].blockType;
        // Determine block type and process as appropriate
        switch (blockType)
        {
        case HeapBlock::HeapBlockType::FreeBlockType:
            // We had a false reference to a free block.  Do nothing.
            break;

        case HeapBlock::HeapBlockType::SmallNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType:
#endif
            return RescanHeapBlock<SmallNormalHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
        case HeapBlock::HeapBlockType::SmallFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType:
#endif
            return RescanHeapBlock<SmallFinalizableHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#ifdef RECYCLER_VISITED_HOST
        case HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType:
            return RescanHeapBlock<SmallRecyclerVisitedHostHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#endif
        case HeapBlock::HeapBlockType::MediumNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType:
#endif
            return RescanHeapBlock<MediumNormalHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
        case HeapBlock::HeapBlockType::MediumFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType:
#endif
            return RescanHeapBlock<MediumFinalizableHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#ifdef RECYCLER_VISITED_HOST
        case HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType:
            return RescanHeapBlock<MediumRecyclerVisitedHostHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#endif
        default:
            // Shouldn't be here -- leaf blocks aren't rescanned, and large blocks are handled separately
            Assert(false);
            break;
        }
    }

    return false;
}